

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool anon_unknown.dwarf_462ca::extract_tar(char *outFileName,bool verbose,bool extract)

{
  FILE *__stream;
  archive_entry *entry_00;
  _Alloc_hider _Var1;
  wchar_t wVar2;
  uint uVar3;
  mode_t mVar4;
  int iVar5;
  char *pcVar6;
  archive *a;
  archive *_a;
  Encoding *pEVar7;
  size_t sVar8;
  wstring *__s;
  int64_t iVar9;
  ulong uVar10;
  dev_t dVar11;
  dev_t dVar12;
  size_t sVar13;
  tm *__tp;
  ssize_t sVar14;
  char *cstr;
  wchar_t *wcstr;
  wchar_t *wcstr_00;
  wchar_t *wcstr_01;
  wchar_t *wcstr_02;
  undefined7 in_register_00000031;
  char *__format;
  bool bVar15;
  archive_entry *entry;
  time_t tim;
  char tmp [100];
  size_t size;
  archive_entry *local_d8;
  time_t local_d0;
  undefined4 local_c4;
  char *local_c0;
  wstring local_b8 [3];
  string local_50;
  
  local_c4 = (undefined4)CONCAT71(in_register_00000031,verbose);
  pcVar6 = setlocale(0,(char *)0x0);
  setlocale(0,"");
  local_c0 = pcVar6;
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_compression_all(a);
  archive_read_support_format_all(a);
  cmsys::Encoding::ToWide_abi_cxx11_(local_b8,(Encoding *)outFileName,cstr);
  wVar2 = archive_read_open_filename_w(a,local_b8[0]._M_dataplus._M_p,0x2800);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
    operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity * 4 + 4);
  }
  if (wVar2 == L'\0') {
LAB_00134040:
    do {
      wVar2 = archive_read_next_header(a,&local_d8);
      entry_00 = local_d8;
      __stream = _stdout;
      if (wVar2 != L'\0') {
        if (wVar2 != L'\x01') {
          pcVar6 = archive_error_string(a);
          cmSystemTools::Error
                    ("Problem with archive_read_next_header(): ",pcVar6,(char *)0x0,(char *)0x0);
        }
        goto LAB_00134120;
      }
      if ((char)local_c4 == '\0') {
        if (!extract) {
          pEVar7 = (Encoding *)archive_entry_pathname_w(local_d8);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_b8,pEVar7,wcstr_00);
          _Var1._M_p = local_b8[0]._M_dataplus._M_p;
          sVar8 = strlen((char *)local_b8[0]._M_dataplus._M_p);
          cmSystemTools::Stdout((char *)_Var1._M_p,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
            operator_delete(local_b8[0]._M_dataplus._M_p,
                            local_b8[0].field_2._M_allocated_capacity + 1);
          }
          cmSystemTools::Stdout("\n",1);
          goto LAB_00134040;
        }
      }
      else {
        if (extract) {
          cmSystemTools::Stdout("x ",2);
          pEVar7 = (Encoding *)archive_entry_pathname_w(local_d8);
          cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_b8,pEVar7,wcstr);
          _Var1._M_p = local_b8[0]._M_dataplus._M_p;
          sVar8 = strlen((char *)local_b8[0]._M_dataplus._M_p);
          cmSystemTools::Stdout((char *)_Var1._M_p,sVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
            operator_delete(local_b8[0]._M_dataplus._M_p,
                            local_b8[0].field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
            time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
          }
          pcVar6 = archive_entry_strmode((archive_entry_conflict *)entry_00);
          uVar3 = archive_entry_nlink(entry_00);
          fprintf(__stream,"%s %d ",pcVar6,(ulong)uVar3);
          __s = (wstring *)archive_entry_uname(entry_00);
          if ((__s == (wstring *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
            iVar9 = archive_entry_uid(entry_00);
            sprintf((char *)local_b8,"%lu ",iVar9);
            __s = local_b8;
          }
          uVar10 = strlen((char *)__s);
          if (uVar10 < 7) {
            uVar10 = 6;
          }
          fprintf(__stream,"%-*s ",uVar10 & 0xffffffff,__s);
          pcVar6 = archive_entry_gname(entry_00);
          if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
            iVar9 = archive_entry_gid(entry_00);
            sprintf((char *)local_b8,"%lu",iVar9);
            sVar8 = strlen((char *)local_b8);
            fputs((char *)local_b8,__stream);
          }
          else {
            fputs(pcVar6,__stream);
            sVar8 = strlen(pcVar6);
          }
          mVar4 = archive_entry_filetype(entry_00);
          if (mVar4 == 0x2000) {
LAB_00133e0f:
            dVar11 = archive_entry_rdevmajor(entry_00);
            dVar12 = archive_entry_rdevminor(entry_00);
            sprintf((char *)local_b8,"%lu,%lu",dVar11,dVar12);
          }
          else {
            mVar4 = archive_entry_filetype(entry_00);
            if (mVar4 == 0x6000) goto LAB_00133e0f;
            iVar9 = archive_entry_size(entry_00);
            sprintf((char *)local_b8,"%lu",iVar9);
          }
          sVar13 = strlen((char *)local_b8);
          iVar5 = (int)(sVar13 + sVar8) + 1;
          if (sVar13 + sVar8 < 0xd) {
            iVar5 = 0xd;
          }
          fprintf(__stream,"%*s",(ulong)(uint)(iVar5 - (int)sVar8),local_b8);
          local_d0 = archive_entry_mtime(entry_00);
          pcVar6 = "%e %b %H:%M";
          if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
              local_d0) {
            pcVar6 = "%e %b  %Y";
          }
          if (local_d0 <
              (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + -0xf099c0) {
            pcVar6 = "%e %b  %Y";
          }
          __tp = localtime(&local_d0);
          strftime((char *)local_b8,100,pcVar6,__tp);
          fprintf(__stream," %s ",local_b8);
          pEVar7 = (Encoding *)archive_entry_pathname_w(entry_00);
          cmsys::Encoding::ToNarrow_abi_cxx11_(&local_50,pEVar7,wcstr_01);
          fputs(local_50._M_dataplus._M_p,__stream);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = archive_entry_hardlink(entry_00);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = archive_entry_symlink(entry_00);
            if (pcVar6 == (char *)0x0) goto LAB_00133f92;
            pcVar6 = archive_entry_symlink(entry_00);
            __format = " -> %s";
          }
          else {
            pcVar6 = archive_entry_hardlink(entry_00);
            __format = " link to %s";
          }
          fprintf(__stream,__format,pcVar6);
        }
LAB_00133f92:
        cmSystemTools::Stdout("\n",1);
        if (!extract) goto LAB_00134040;
      }
      wVar2 = archive_write_disk_set_options(_a,L'\x04');
      if (wVar2 != L'\0') {
        pcVar6 = archive_error_string(_a);
        cmSystemTools::Error
                  ("Problem with archive_write_disk_set_options(): ",pcVar6,(char *)0x0,(char *)0x0)
        ;
        goto LAB_00134120;
      }
      wVar2 = archive_write_header(_a,local_d8);
      if (wVar2 != L'\0') {
        pcVar6 = archive_error_string(_a);
        cmSystemTools::Error("Problem with archive_write_header(): ",pcVar6,(char *)0x0,(char *)0x0)
        ;
        pEVar7 = (Encoding *)archive_entry_pathname_w(local_d8);
        cmsys::Encoding::ToNarrow_abi_cxx11_((string *)local_b8,pEVar7,wcstr_02);
        cmSystemTools::Error
                  ("Current file: ",(char *)local_b8[0]._M_dataplus._M_p,(char *)0x0,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_b8[0]._M_dataplus._M_p != &local_b8[0].field_2) {
          operator_delete(local_b8[0]._M_dataplus._M_p,local_b8[0].field_2._M_allocated_capacity + 1
                         );
        }
        goto LAB_00134120;
      }
      do {
        iVar5 = archive_read_data_block(a,(void **)local_b8,(size_t *)&local_50,&local_d0);
        if (iVar5 != 0) goto LAB_0013402e;
        sVar14 = archive_write_data_block
                           (_a,local_b8[0]._M_dataplus._M_p,(size_t)local_50._M_dataplus._M_p,
                            local_d0);
      } while (sVar14 == 0);
      pcVar6 = archive_error_string(_a);
      cmSystemTools::Message("archive_write_data_block()",pcVar6);
LAB_0013402e:
      wVar2 = archive_write_finish_entry(_a);
      if (wVar2 != L'\0') goto LAB_00134105;
    } while( true );
  }
  pcVar6 = archive_error_string(a);
  cmSystemTools::Error("Problem with archive_read_open_file(): ",pcVar6,(char *)0x0,(char *)0x0);
  archive_write_free(_a);
  archive_read_close(a);
  bVar15 = false;
LAB_0013413e:
  setlocale(0,local_c0);
  return bVar15;
LAB_00134105:
  pcVar6 = archive_error_string(_a);
  cmSystemTools::Error("Problem with archive_write_finish_entry(): ",pcVar6,(char *)0x0,(char *)0x0)
  ;
LAB_00134120:
  archive_write_free(_a);
  archive_read_close(a);
  archive_read_finish(a);
  bVar15 = wVar2 == L'\x01';
  goto LAB_0013413e;
}

Assistant:

bool extract_tar(const char* outFileName, bool verbose,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive *ext = archive_write_disk_new();
  archive_read_support_compression_all(a);
  archive_read_support_format_all(a);
  struct archive_entry *entry;
  int r = cm_archive_read_open_file(a, outFileName, 10240);
  if(r)
    {
    cmSystemTools::Error("Problem with archive_read_open_file(): ",
                         archive_error_string(a));
    archive_write_free(ext);
    archive_read_close(a);
    return false;
    }
  for (;;)
    {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF)
      {
      break;
      }
    if (r != ARCHIVE_OK)
      {
      cmSystemTools::Error("Problem with archive_read_next_header(): ",
                           archive_error_string(a));
      break;
      }
    if(verbose)
      {
      if(extract)
        {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
        }
      else
        {
        list_item_verbose(stdout, entry);
        }
      cmSystemTools::Stdout("\n");
      }
    else if(!extract)
      {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry).c_str());
      cmSystemTools::Stdout("\n");
      }
    if(extract)
      {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK)
        {
        cmSystemTools::Error(
          "Problem with archive_write_disk_set_options(): ",
          archive_error_string(ext));
        break;
        }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK)
        {
        copy_data(a, ext);
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK)
          {
          cmSystemTools::Error("Problem with archive_write_finish_entry(): ",
                               archive_error_string(ext));
          break;
          }
        }
#ifdef _WIN32
      else if(const char* linktext = archive_entry_symlink(entry))
        {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry)
                  << "\" -> \""
                  << linktext << "\"." << std::endl;
        }
#endif
      else
        {
        cmSystemTools::Error("Problem with archive_write_header(): ",
                             archive_error_string(ext));
        cmSystemTools::Error("Current file: ",
                             cm_archive_entry_pathname(entry).c_str());
        break;
        }
      }
    }